

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::
foreach<Ptex::v2_2::PtexReaderCache::Purger>
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,Purger *fn)

{
  Entry *pEVar1;
  ulong uVar2;
  PtexCachedReader **ppPVar3;
  
  pEVar1 = getEntries(this);
  ppPVar3 = &pEVar1->value;
  for (uVar2 = 0; uVar2 < this->_numEntries; uVar2 = uVar2 + 1) {
    if (*ppPVar3 != (PtexCachedReader *)0x0) {
      PtexReaderCache::Purger::operator()(fn,*ppPVar3);
    }
    ppPVar3 = ppPVar3 + 4;
  }
  return;
}

Assistant:

void foreach(Fn& fn)
    {
        Entry* entries = getEntries();
        for (uint32_t i = 0; i < _numEntries; ++i) {
            Value v = entries[i].value;
            if (v) fn(v);
        }
    }